

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vorbisfile.c
# Opt level: O3

int ov_halfrate(OggVorbis_File *vf,int flag)

{
  int iVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  
  if (vf->vi != (vorbis_info *)0x0) {
    bVar2 = false;
    do {
      if (3 < vf->ready_state) {
        vorbis_dsp_clear(&vf->vd);
        vorbis_block_clear(&vf->vb);
        vf->ready_state = 3;
        lVar3 = vf->pcm_offset;
        if (-1 < lVar3) {
          vf->pcm_offset = -1;
          ov_pcm_seek(vf,lVar3);
        }
      }
      iVar1 = 0;
      if (vf->links < 1) {
LAB_001a8577:
        if (bVar2) {
          return -0x83;
        }
        return iVar1;
      }
      lVar3 = 0;
      lVar4 = 0;
      while (iVar1 = vorbis_synthesis_halfrate((vorbis_info *)((long)&vf->vi->version + lVar3),flag)
            , iVar1 == 0) {
        lVar4 = lVar4 + 1;
        lVar3 = lVar3 + 0x38;
        iVar1 = 0;
        if (vf->links <= lVar4) goto LAB_001a8577;
      }
      if (flag == 0) {
        iVar1 = -0x83;
        goto LAB_001a8577;
      }
      flag = 0;
      bVar2 = true;
    } while (vf->vi != (vorbis_info *)0x0);
  }
  return -0x83;
}

Assistant:

int ov_halfrate(OggVorbis_File *vf,int flag){
  int i;
  if(vf->vi==NULL)return OV_EINVAL;
  if(vf->ready_state>STREAMSET){
    /* clear out stream state; dumping the decode machine is needed to
       reinit the MDCT lookups. */
    vorbis_dsp_clear(&vf->vd);
    vorbis_block_clear(&vf->vb);
    vf->ready_state=STREAMSET;
    if(vf->pcm_offset>=0){
      ogg_int64_t pos=vf->pcm_offset;
      vf->pcm_offset=-1; /* make sure the pos is dumped if unseekable */
      ov_pcm_seek(vf,pos);
    }
  }

  for(i=0;i<vf->links;i++){
    if(vorbis_synthesis_halfrate(vf->vi+i,flag)){
      if(flag) ov_halfrate(vf,0);
      return OV_EINVAL;
    }
  }
  return 0;
}